

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O3

uint8_t __thiscall create::Create::getIRRight(Create *this)

{
  bool bVar1;
  uint8_t uVar2;
  Packet *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  uint16_t uVar3;
  
  bVar1 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'5');
  if (bVar1) {
    Data::getPacket((Data *)&local_18,
                    (uint8_t)(this->data).
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar3 = Packet::getData(local_18);
    uVar2 = (uint8_t)uVar3;
    if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[create::Create] ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Right IR sensor not supported!",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    uVar2 = 0xff;
  }
  return uVar2;
}

Assistant:

uint8_t Create::getIRRight() const {
    if (data->isValidPacketID(ID_IR_RIGHT)) {
      return GET_DATA(ID_IR_RIGHT);
    }
    else {
      CERR("[create::Create] ", "Right IR sensor not supported!");
      return -1;
    }
  }